

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

size_t __thiscall
std::hash<groundupdb::HashedValue>::operator()(hash<groundupdb::HashedValue> *this,HashedValue *v)

{
  bool bVar1;
  reference pbVar2;
  byte *vpart;
  const_iterator __end2;
  const_iterator __begin2;
  Bytes *__range2;
  size_t hv;
  HashedValue *v_local;
  hash<groundupdb::HashedValue> *this_local;
  
  __range2 = (Bytes *)0x0;
  groundupdb::HashedValue::data((Bytes *)&__begin2,v);
  __end2 = vector<std::byte,_std::allocator<std::byte>_>::begin
                     ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin2);
  vpart = (byte *)vector<std::byte,_std::allocator<std::byte>_>::end
                            ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin2);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
                                *)&vpart);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>
             ::operator*(&__end2);
    __range2 = (Bytes *)((ulong)__range2 ^ (ulong)*pbVar2 << 1);
    __gnu_cxx::
    __normal_iterator<const_std::byte_*,_std::vector<std::byte,_std::allocator<std::byte>_>_>::
    operator++(&__end2);
  }
  vector<std::byte,_std::allocator<std::byte>_>::~vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)&__begin2);
  return (size_t)__range2;
}

Assistant:

size_t operator()(const groundupdb::HashedValue& v) const
        {
          std::size_t hv = 0;
          for (auto& vpart : v.data()) {
            hv = hv ^ (std::to_integer<std::size_t>(vpart) << 1);
          }
          return hv;
        }